

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# presagearchive.c
# Opt level: O1

PresageArchive * PresageArchive_NewFromFiles(char *path1,char *path2,LPStatus *status)

{
  PresageArchiveKind PVar1;
  uint16_t internal_id_00;
  LPStatus LVar2;
  int iVar3;
  uint uVar4;
  PresageArchive *archive;
  PRDPRS *pPVar5;
  PresageArchiveMember **ppPVar6;
  PresageArchiveMember *member;
  long lVar7;
  FILE *__stream;
  ulong uVar8;
  PRDPRS *pPVar9;
  uint16_t *dest;
  uint16_t internal_id;
  uint16_t actual_n_entries;
  uint8_t magic;
  uint32_t size;
  uint32_t rid;
  uint32_t offset;
  LPStatus new_archive_status;
  PresageArchiveMemberFiletype filetype;
  LPStatus new_member_status;
  uint16_t local_76;
  ushort local_74;
  uint8_t local_71;
  LPStatus *local_70;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t local_60;
  LPStatus local_5c;
  PresageArchive *local_58;
  char local_4c [4];
  LPStatus local_48 [6];
  
  local_70 = status;
  archive = (PresageArchive *)calloc(1,0x20);
  if (archive == (PresageArchive *)0x0) {
    LVar2 = LUNAPURPURA_ERROR;
  }
  else {
    archive->kind = (uint)(path2 == (char *)0x0 || path1 == (char *)0x0);
    if (path2 == (char *)0x0 || path1 == (char *)0x0) {
      pPVar5 = (PRDPRS *)PRX_New(path1,&local_5c);
    }
    else {
      pPVar5 = PRDPRS_New(path1,path2,&local_5c);
    }
    if (local_5c != LUNAPURPURA_OK) {
      *local_70 = local_5c;
      goto LAB_00102cc8;
    }
    (archive->archive).prx = (PRX *)pPVar5;
    if (archive->kind < 2) {
      path1 = (char *)((archive->archive).prdprs)->header_fp;
    }
    ReadUint8((FILE *)path1,1,&local_71);
    LVar2 = LUNAPURPURA_BADMAGIC;
    if (local_71 == '\x01') {
      fseek((FILE *)path1,0x89,1);
      ReadUint16LE((FILE *)path1,1,&local_74);
      dest = &archive->n_entries;
      ReadUint16LE((FILE *)path1,1,dest);
      fseek((FILE *)path1,2,1);
      ppPVar6 = (PresageArchiveMember **)calloc((ulong)archive->n_entries,0x30);
      archive->members = ppPVar6;
      fseek((FILE *)path1,0x18,1);
      if (archive->n_entries != 0) {
        uVar8 = 0;
        local_58 = archive;
        do {
          member = PresageArchiveMember_New(local_48);
          LVar2 = local_48[0];
          if (local_48[0] == LUNAPURPURA_OK) {
            ReadUint16LE((FILE *)path1,1,&local_76);
            internal_id_00 = local_76;
            if (local_76 == 0) {
              internal_id_00 = (short)*(undefined4 *)dest + 1;
            }
            PresageArchiveMember_SetInternalId(member,internal_id_00);
            fseek((FILE *)path1,6,1);
            ReadUint32LE((FILE *)path1,1,&local_60);
            PresageArchiveMember_SetOffset(member,local_60);
            ReadChar((FILE *)path1,4,local_4c);
            PresageArchiveMember_SetFiletype(member,local_4c);
            ReadUint32LE((FILE *)path1,1,&local_64);
            PresageArchiveMember_SetResourceId(member,local_64);
            ReadUint32LE((FILE *)path1,1,&local_68);
            PresageArchiveMember_SetSize(member,local_68);
            local_58->members[uVar8] = member;
            iVar3 = 0;
            archive = local_58;
          }
          else {
            *local_70 = local_48[0];
            iVar3 = 2;
          }
          if (LVar2 != LUNAPURPURA_OK) goto LAB_00102c71;
          uVar8 = uVar8 + 1;
        } while (uVar8 < *dest);
      }
      iVar3 = 5;
LAB_00102c71:
      if (iVar3 == 2) goto LAB_00102cc8;
      if (iVar3 != 5) {
        return archive;
      }
      fseek((FILE *)path1,((ulong)local_74 - (ulong)archive->n_entries) * 0x18,1);
      if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
        lVar7 = ftell((FILE *)path1);
        archive->data_offset_start = (uint32_t)lVar7;
      }
      PVar1 = archive->kind;
      pPVar5 = (PRDPRS *)(ulong)PVar1;
      if (PVar1 == PRESAGE_ARCHIVE_KIND_PRX) {
        pPVar5 = (archive->archive).prdprs;
      }
      else {
        if (PVar1 != PRESAGE_ARCHIVE_KIND_PRDPRS) {
          __stream = (FILE *)0x0;
          goto LAB_00102cf0;
        }
        pPVar5 = (PRDPRS *)&((archive->archive).prdprs)->data_fp;
      }
      __stream = (FILE *)pPVar5->header_fp;
LAB_00102cf0:
      if (*dest != 0) {
        pPVar9 = (PRDPRS *)0x0;
        do {
          uVar4 = (uint)pPVar5;
          if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
            uVar4 = archive->members[(long)pPVar9]->offset + archive->data_offset_start;
          }
          else if (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
            uVar4 = archive->members[(long)pPVar9]->offset;
          }
          fseek(__stream,(ulong)uVar4,0);
          fseek(__stream,(ulong)(archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) | 0xffffffffffffffea,
                1);
          ReadChar((FILE *)__stream,0x10,(char *)local_48);
          PresageArchiveMember_SetName(archive->members[(long)pPVar9],(char *)local_48);
          pPVar9 = (PRDPRS *)((long)&pPVar9->header_fp + 1);
          pPVar5 = (PRDPRS *)(ulong)archive->n_entries;
        } while (pPVar9 < pPVar5);
      }
      *local_70 = LUNAPURPURA_OK;
      return archive;
    }
  }
  *local_70 = LVar2;
LAB_00102cc8:
  PresageArchive_Close(archive);
  return (PresageArchive *)0x0;
}

Assistant:

PresageArchive *
PresageArchive_NewFromFiles(const char *path1, const char *path2, LPStatus *status)
{
	PresageArchive *archive = calloc(1, sizeof(PresageArchive));

	if (!archive) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	if (path1 && path2) {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRDPRS;
	} else {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRX;
	}

	LPStatus new_archive_status;

	switch (archive->kind) {
	case PRESAGE_ARCHIVE_KIND_PRDPRS:
		{
			PRDPRS *prdprs = PRDPRS_New(path1, path2, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prdprs = prdprs;
		}
		break;
	case PRESAGE_ARCHIVE_KIND_PRX:
		{
			PRX *prx = PRX_New(path1, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prx = prx;
		}
		break;
	}

	/*
	 * At this stage in the process, we are only concerned about the members'
	 * metadata, so, obtain the appropriate file pointer for that task.
	 */
	FILE *fp;
	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: fp = archive->archive.prdprs->header_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: fp = archive->archive.prx->fp; break;
	}

	uint8_t magic;
	ReadUint8(fp, 1, &magic);
	if (magic != PRX_MAGIC) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	/* 128 + 10 - 1, I guess -- all zeroes */
	fseek(fp, 137L, SEEK_CUR);

	/*
	 * This is the number of entries _including_ dummy ones, which may be
	 * present at the start and/or end of the archive's table of contents.
	 */
	uint16_t actual_n_entries;
	ReadUint16LE(fp, 1, &actual_n_entries);

	/* This is the real count of entries we ultimately care about. */
	ReadUint16LE(fp, 1, &archive->n_entries);

	fseek(fp, 2L, SEEK_CUR); /* Ignore */

	archive->members = calloc(archive->n_entries, sizeof(PresageArchiveMember));

	/*
	 * Purposefully skip over the zeroeth entry (which has internal_id of 1),
	 * it's always a "dummy" entry which serves little purpose.
	 */
	fseek(fp, 24L, SEEK_CUR);

	/*
	 * OK now we *finally* can access the individual archive members.
	 */
	for (int i = 0; i < archive->n_entries; i++) {
		LPStatus new_member_status;
		PresageArchiveMember *member = PresageArchiveMember_New(&new_member_status);

		if (new_member_status != LUNAPURPURA_OK) {
			*status = new_member_status;
			goto fail;
		}

		/*
		 * The last internal_id is always stored as '0' rather than what you'd
		 * expect. Anthony Kozar suspects this is to merely signify the end of the
		 * list, since we already know how many members there are by now.
		 */
		uint16_t internal_id;
		ReadUint16LE(fp, 1, &internal_id);
		if (internal_id == 0) {
			PresageArchiveMember_SetInternalId(member, archive->n_entries+1);
		} else {
			PresageArchiveMember_SetInternalId(member, internal_id);
		}

		fseek(fp, 6L, SEEK_CUR);

		uint32_t offset;
		ReadUint32LE(fp, 1, &offset);
		PresageArchiveMember_SetOffset(member, offset);

		PresageArchiveMemberFiletype filetype;
		ReadChar(fp, sizeof(PresageArchiveMemberFiletype), filetype);
		PresageArchiveMember_SetFiletype(member, filetype);

		uint32_t rid;
		ReadUint32LE(fp, 1, &rid);
		PresageArchiveMember_SetResourceId(member, rid);

		uint32_t size;
		ReadUint32LE(fp, 1, &size);
		PresageArchiveMember_SetSize(member, size);

		archive->members[i] = member;
	}

	/*
	 * Account for the dummy entries at the end of the table of contents, if
	 * necessary.
	 */
	fseek(fp, 24L*(actual_n_entries - archive->n_entries), SEEK_CUR);

	/*
	 * In PRXes, the "offset" field for each member does NOT indicate an absolute
	 * offset. It's actually an offset from the position of the file we're
	 * currently at right now. So let's keep track of it.
	 */
	if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
		archive->data_offset_start = ftell(fp);
	}

	/*
	 * OK now let's figure out the individual member names. We start with the
	 * 1st member (not the 0th member) because remember we actually can't
	 * obtain information about the "dummy" entry at the beginning.
	 *
	 * Also, the offset brings us to the start of the data, but that skips
	 * past the filename!  So that's why we rewind a little.
	 *
	 * This is a little tricky because, in PRD/PRS pairs, the member names are
	 * NOT stored in the header. So we have to bring the other file pointer into
	 * the picture now.
	 */
	FILE *name_finder_fp = NULL;

	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: name_finder_fp = archive->archive.prdprs->data_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: name_finder_fp = archive->archive.prx->fp; break;
	}

	for (int i = 0; i < archive->n_entries; i++) {
		uint32_t abs_offset = PresageArchive_AbsoluteOffsetForMemberAtIndex(archive, i);
		fseek(name_finder_fp, abs_offset, SEEK_SET);

		/* 
		 * Rewind to get the filename. Purposefully avoid an extra underscore in
		 * PRD/PRS members.
		 */
		long rewind_amt = PRESAGEARCHIVEMEMBER_NAME_LEN;
		rewind_amt += (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) ? 5 : 6;
		fseek(name_finder_fp, -rewind_amt, SEEK_CUR); 

		PresageArchiveMemberName name;
		ReadChar(name_finder_fp, sizeof(PresageArchiveMemberName), name);
		PresageArchiveMember_SetName(archive->members[i], name);
	}

	*status = LUNAPURPURA_OK;
	return archive;

fail:
	PresageArchive_Close(archive);
	return NULL;
}